

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

bool doctest::anon_unknown_15::parseOptionImpl(int argc,char **argv,char *pattern,String *value)

{
  char cVar1;
  char *__haystack;
  char *__s;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  ulong uVar5;
  String local_48;
  
  uVar5 = (ulong)(uint)argc;
  do {
    if ((int)uVar5 < 1) {
      return false;
    }
    __haystack = argv[uVar5 - 1];
    __s = strstr(__haystack,pattern);
    if (__s != (char *)0x0) {
      pcVar4 = __haystack;
      if (value == (String *)0x0) {
        sVar2 = strlen(__s);
        sVar3 = strlen(pattern);
        if (sVar2 != sVar3) goto LAB_0010a3f5;
      }
      do {
        if (pcVar4 == __s) {
          if (*__haystack == '-') {
            if (value == (String *)0x0) {
              return 0 < (int)uVar5;
            }
            sVar2 = strlen(pattern);
            sVar3 = strlen(__s + sVar2);
            if ((int)sVar3 != 0) {
              String::String(&local_48,__s + sVar2);
              String::operator=(value,&local_48);
              String::~String(&local_48);
              return true;
            }
          }
          break;
        }
        cVar1 = *pcVar4;
        pcVar4 = pcVar4 + 1;
      } while (cVar1 == '-');
    }
LAB_0010a3f5:
    uVar5 = uVar5 - 1;
  } while( true );
}

Assistant:

bool parseOptionImpl(int argc, const char* const* argv, const char* pattern, String* value) {
        // going from the end to the beginning and stopping on the first occurrence from the end
        for(int i = argc; i > 0; --i) {
            auto index = i - 1;
            auto temp = std::strstr(argv[index], pattern);
            if(temp && (value || strlen(temp) == strlen(pattern))) { //!OCLINT prefer early exits and continue
                // eliminate matches in which the chars before the option are not '-'
                bool noBadCharsFound = true;
                auto curr            = argv[index];
                while(curr != temp) {
                    if(*curr++ != '-') {
                        noBadCharsFound = false;
                        break;
                    }
                }
                if(noBadCharsFound && argv[index][0] == '-') {
                    if(value) {
                        // parsing the value of an option
                        temp += strlen(pattern);
                        const unsigned len = strlen(temp);
                        if(len) {
                            *value = temp;
                            return true;
                        }
                    } else {
                        // just a flag - no value
                        return true;
                    }
                }
            }
        }
        return false;
    }